

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplaceRealloc<>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,pointer pos)

{
  ulong uVar1;
  _Storage<slang::ConstantRange,_true> *p_Var2;
  undefined8 uVar3;
  _Storage<slang::ConstantRange,_true> _Var4;
  LoopDim *__cur_1;
  pointer pLVar5;
  pointer pLVar6;
  pointer pLVar7;
  pointer pLVar8;
  LoopDim *__cur;
  long lVar9;
  IteratorSymbol *ctx;
  IteratorSymbol *pIVar10;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  pIVar10 = (IteratorSymbol *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (IteratorSymbol *)(uVar1 * 2);
  if (pIVar10 < ctx) {
    pIVar10 = ctx;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    pIVar10 = (IteratorSymbol *)0x555555555555555;
  }
  lVar9 = (long)pos - (long)this->data_;
  pLVar5 = (pointer)operator_new((long)pIVar10 * 0x18);
  *(undefined8 *)((long)pLVar5 + lVar9) = 0;
  ((undefined8 *)((long)pLVar5 + lVar9))[1] = 0;
  *(undefined8 *)((long)pLVar5 + lVar9 + 0x10) = 0;
  pLVar8 = this->data_;
  pLVar6 = pLVar8 + this->len;
  pLVar7 = pLVar5;
  if (pLVar6 == pos) {
    for (; pLVar8 != pos; pLVar8 = pLVar8 + 1) {
      pLVar7->loopVar = pLVar8->loopVar;
      uVar3 = *(undefined8 *)
               &(pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged;
      (pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload =
           (pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange>._M_payload;
      *(undefined8 *)
       &(pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar3;
      pLVar7 = pLVar7 + 1;
    }
  }
  else {
    for (; pLVar8 != pos; pLVar8 = pLVar8 + 1) {
      ctx = pLVar8->loopVar;
      pLVar7->loopVar = ctx;
      uVar3 = *(undefined8 *)
               &(pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged;
      (pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload =
           (pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange>._M_payload;
      *(undefined8 *)
       &(pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar3;
      pLVar7 = pLVar7 + 1;
    }
    p_Var2 = (_Storage<slang::ConstantRange,_true> *)((long)pLVar5 + lVar9);
    for (; pos != pLVar6; pos = pos + 1) {
      p_Var2[5] = (_Storage<slang::ConstantRange,_true>)pos->loopVar;
      _Var4 = *(_Storage<slang::ConstantRange,_true> *)
               &(pos->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged;
      p_Var2[3] = (pos->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_payload;
      p_Var2[4] = _Var4;
      p_Var2 = p_Var2 + 3;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pIVar10;
  this->data_ = pLVar5;
  return (pointer)((long)pLVar5 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}